

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExecFPU_cpp.h
# Opt level: O2

bool __thiscall moira::Moira::isValidExtFPU(Moira *this,Instr I,Mode M,u16 op,u32 ext)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  
  if (I - FDBcc < 10) {
    uVar1 = ext >> 0xd & 7;
    switch(I) {
    case FDBcc:
    case FScc:
switchD_0012faaa_caseD_be:
      uVar1 = ext & 0xffe0;
      goto LAB_0012fb3c;
    default:
switchD_0012faaa_caseD_bf:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraExecFPU_cpp.h"
                    ,0x74,"bool moira::Moira::isValidExtFPU(Instr, Mode, u16, u32) const");
    case FMOVE:
      switch(uVar1) {
      case 0:
        uVar1 = ext & 0x7f;
        bVar4 = (op & 0x3f) == 0;
LAB_0012fac8:
        bVar4 = (bool)(bVar4 | uVar1 != 0);
LAB_0012facd:
        bVar3 = 1;
        if (bVar4) goto LAB_0012fc9d;
        break;
      case 1:
        break;
      case 2:
        bVar3 = 1;
        if (M != IP) goto LAB_0012fc9d;
        break;
      case 3:
        if ((ext & 0xc00) == 0xc00 || (ext & 0x7f) == 0) {
          if (M == AN) {
            if ((ext & 0xc00) != 0xc00) goto LAB_0012fc56;
          }
          else if (M == DN) {
            if ((~ext & 0x1400) != 0 && (ext & 0x1800) != 0x800) {
LAB_0012fc56:
              uVar1 = ~ext & 0x1c00;
              bVar4 = (ext & 0xf) == 0;
              goto LAB_0012fac8;
            }
          }
          else if (3 < M - DIPC) goto LAB_0012fc56;
        }
        break;
      case 4:
switchD_0012fabc_caseD_4:
        bVar4 = M != IP && (ext & 0x3ff) == 0;
LAB_0012fbce:
        bVar3 = 1;
        if (bVar4) goto LAB_0012fc9d;
        break;
      case 5:
switchD_0012fabc_caseD_5:
        if ((ext & 0x3ff) == 0) {
          if (M < AI) {
            bVar3 = 0x17 >> ((byte)(ext >> 10) & 7);
            goto LAB_0012fc9d;
          }
          bVar3 = 1;
          if (3 < M - DIPC) goto LAB_0012fc9d;
        }
        break;
      default:
switchD_0012fabc_caseD_6:
        if (((((ext & 0x700) == 0) && (uVar2 = ext >> 0xb & 3, (ext & 0x8f) == 0 || uVar2 != 3)) &&
            ((IP < M || ((0x1e03U >> (M & 0x1f) & 1) == 0)))) && (M != AI || 1 < uVar2)) {
          if (M == PD) {
            if (((ext >> 0xc & 1) == 0) && (uVar1 != 6)) {
              bVar4 = (ext & 0x8f) == 0 || uVar2 != 1;
              goto LAB_0012facd;
            }
          }
          else {
            if (M == PI) {
              bVar4 = uVar1 != 7 && 1 < uVar2;
              goto LAB_0012fbce;
            }
            bVar3 = 1;
            if (3 < M - DI || 1 < uVar2) goto LAB_0012fc9d;
          }
        }
      }
      break;
    case FMOVEM:
      if (uVar1 - 6 < 2) goto switchD_0012fabc_caseD_6;
      if (uVar1 == 4) goto switchD_0012fabc_caseD_4;
      if (uVar1 == 5) goto switchD_0012fabc_caseD_5;
    }
    bVar3 = 0;
  }
  else {
    if (I != FMOVECR) {
      if (I != FTRAPcc) goto switchD_0012faaa_caseD_bf;
      goto switchD_0012faaa_caseD_be;
    }
    uVar1 = op & 0x3f;
LAB_0012fb3c:
    bVar3 = uVar1 == 0;
  }
LAB_0012fc9d:
  return (bool)(bVar3 & 1);
}

Assistant:

bool
Moira::isValidExtFPU(Instr I, Mode M, u16 op, u32 ext) const
{
    auto cod  = xxx_____________ (ext);
    auto mode = ___xx___________ (ext);
    auto fmt  = ___xxx__________ (ext);
    auto lst  = ___xxx__________ (ext);
    auto cmd  = _________xxxxxxx (ext);

    switch (I) {

        case Instr::FDBcc:
        case Instr::FScc:
        case Instr::FTRAPcc:

            return (ext & 0xFFE0) == 0;

        case Instr::FMOVECR:

            return (op & 0x3F) == 0;

        case Instr::FMOVE:

            switch (cod) {

                case 0b010:

                    if (M == Mode::IP) break;
                    return true;

                case 0b000:

                    if (cmd == 0 && cod == 0 && (op & 0x3F)) break;
                    return true;

                case 0b011:

                    if (fmt != 0b011 && fmt != 0b111 && (ext & 0x7F)) break;

                    if (M == Mode::DN) {
                        if (fmt == 0b010 || fmt == 0b011 || fmt == 0b101 || fmt == 0b111) break;
                    }
                    if (M == Mode::AN) {
                        if (fmt == 0b011 || fmt == 0b111) break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    } else {
                        if (fmt == 0b111 && (ext & 0xF)) break;
                    }

                    return true;
            }

        case Instr::FMOVEM:

            switch (cod) {

                case 0b101:
                {

                    if (ext & 0x3FF) break;

                    if (M == Mode::DN || M == Mode::AN) {
                        if (lst != 0b000 && lst != 0b001 && lst != 0b010 && lst != 0b100) break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    }
                    return true;
                }
                case 0b100:

                    if (ext & 0x3FF) break;
                    if (M == Mode::IP) break;
                    return true;

                case 0b110:
                case 0b111:

                    if (ext & 0x0700) break;
                    if (mode == 3 && (ext & 0x8F)) break;

                    if (M == Mode::DN || M == Mode::AN) {
                        break;
                    }
                    if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM || M == Mode::IP) {
                        break;
                    }
                    if (M == Mode::AI) {
                        if (mode == 0 || mode == 1) break;
                    }
                    if (M == Mode::PI) {
                        if (mode == 0 || mode == 1 || cod == 0b111) break;
                    }
                    if (M == Mode::PD) {
                        if (cod == 0b110) break;
                        if (cod == 0b111 && (mode == 1) && (ext & 0x8F)) break;
                        if (cod == 0b111 && (mode == 2 || mode == 3)) break;
                    }
                    if (M == Mode::DI || M == Mode::IX || M == Mode::AW || M == Mode::AL) {
                        if (mode == 0 || mode == 1) break;
                    }
                    return true;
            }
            return false;

        default:
            fatalError;
    }
}